

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on,unsigned_long>
::
transit_state<vending::vending_def::on::out_of_service,vending::vending_def::on::maintenance,vending::events::start_maintenance,afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::out_of_service,vending::events::start_maintenance,vending::vending_def::on::check_secret>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::out_of_service,vending::vending_def::on::maintenance>,afsm::transitions::detail::state_exit<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<vending::vending_def::on::out_of_service,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::events::start_maintenance>,afsm::transitions::detail::state_enter<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::inner_state_machine<vending::vending_def::on::maintenance,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::events::start_maintenance>,afsm::transitions::detail::state_clear<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<vending::vending_def::on::out_of_service,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
          (state_transition_table<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on,unsigned_long>
           *this,undefined8 event)

{
  event_process_result eVar1;
  undefined1 local_1;
  
  eVar1 = transit_state_impl<afsm::state<vending::vending_def::on::out_of_service,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<vending::vending_def::on::maintenance,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,vending::events::start_maintenance,afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::out_of_service,vending::events::start_maintenance,vending::vending_def::on::check_secret>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::out_of_ser___n,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
                    (this,event,this + 0x68,this + 0x40,1,&local_1);
  return eVar1;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }